

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,unsigned_char,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>>
               (string_t *ldata,uchar *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uchar uVar3;
  ValidityMask *mask_00;
  ulong uVar4;
  char **ppcVar5;
  ulong uVar6;
  ValidityMask *pVVar7;
  void *pvVar8;
  ValidityMask *pVVar9;
  string_t input;
  string_t input_00;
  string_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar5 = &(ldata->value).pointer.ptr;
    pvVar8 = dataptr;
    for (pVVar7 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar7;
        pVVar7 = (ValidityMask *)
                 ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      input.value.pointer.ptr = (char *)result_mask;
      input.value._0_8_ = *ppcVar5;
      uVar3 = VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
              Operation<duckdb::string_t,unsigned_char>
                        (*(VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> **)
                          (ppcVar5 + -1),input,pVVar7,(idx_t)dataptr,pvVar8);
      result_data[(long)pVVar7] = uVar3;
      ppcVar5 = ppcVar5 + 2;
    }
  }
  else {
    pvVar8 = dataptr;
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    pVVar7 = (ValidityMask *)0x0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        pVVar9 = pVVar7 + 2;
        if (count <= pVVar7 + 2) {
          pVVar9 = (ValidityMask *)count;
        }
LAB_006c62aa:
        ppcVar5 = &ldata[(long)pVVar7].value.pointer.ptr;
        for (; mask_00 = pVVar7, pVVar7 < pVVar9;
            pVVar7 = (ValidityMask *)
                     ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
            ) {
          input_00.value.pointer.ptr = (char *)result_mask;
          input_00.value._0_8_ = *ppcVar5;
          uVar3 = VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
                  Operation<duckdb::string_t,unsigned_char>
                            (*(VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> **)
                              (ppcVar5 + -1),input_00,pVVar7,(idx_t)dataptr,pvVar8);
          result_data[(long)pVVar7] = uVar3;
          ppcVar5 = ppcVar5 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        pVVar9 = pVVar7 + 2;
        if (count <= pVVar7 + 2) {
          pVVar9 = (ValidityMask *)count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006c62aa;
        mask_00 = pVVar9;
        if (uVar2 != 0) {
          ppcVar5 = &ldata[(long)pVVar7].value.pointer.ptr;
          for (uVar6 = 0;
              mask_00 = (ValidityMask *)
                        ((long)&(pVVar7->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                        uVar6), mask_00 < pVVar9; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              input_01.value.pointer.ptr = (char *)result_mask;
              input_01.value._0_8_ = *ppcVar5;
              uVar3 = VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric>::
                      Operation<duckdb::string_t,unsigned_char>
                                (*(VectorTryCastErrorOperator<duckdb::CastFromBitToNumeric> **)
                                  (ppcVar5 + -1),input_01,mask_00,(idx_t)dataptr,pvVar8);
              (result_data + (long)pVVar7)[uVar6] = uVar3;
            }
            ppcVar5 = ppcVar5 + 2;
          }
        }
      }
      pVVar7 = mask_00;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}